

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

Error __thiscall asmjit::CodeBuilder::registerLabelNode(CodeBuilder *this,CBLabel *node)

{
  CodeHolder *this_00;
  int line;
  Error EVar1;
  undefined8 in_RAX;
  char *msg;
  ulong uVar2;
  uint32_t id;
  
  id = (uint32_t)((ulong)in_RAX >> 0x20);
  EVar1 = (this->super_CodeEmitter)._lastError;
  if (EVar1 == 0) {
    this_00 = (this->super_CodeEmitter)._code;
    if (this_00 == (CodeHolder *)0x0) {
      msg = "_code != nullptr";
      line = 0x61;
LAB_00151039:
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/codebuilder.cpp"
                 ,line,msg);
    }
    EVar1 = CodeHolder::newLabelId(this_00,&id);
    if (EVar1 == 0) {
      uVar2 = (ulong)(id - 0x100);
      if (uVar2 < (this->_cbLabels).super_ZoneVectorBase._length) {
        msg = "_cbLabels.getLength() < index + 1";
        line = 0x6a;
        goto LAB_00151039;
      }
      EVar1 = ZoneVectorBase::_resize
                        (&(this->_cbLabels).super_ZoneVectorBase,&this->_cbHeap,8,uVar2 + 1);
      if (EVar1 == 0) {
        if ((this->_cbLabels).super_ZoneVectorBase._length <= uVar2) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/../base/zone.h"
                     ,0x31b,"i < _length");
        }
        *(CBLabel **)((long)(this->_cbLabels).super_ZoneVectorBase._data + uVar2 * 8) = node;
        node->_id = id;
        EVar1 = 0;
      }
    }
  }
  return EVar1;
}

Assistant:

Error CodeBuilder::registerLabelNode(CBLabel* node) noexcept {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  // Don't call setLastError() from here, we are noexcept and we are called
  // by `newLabelNode()` and `newFuncNode()`, which are noexcept as well.
  uint32_t id;
  ASMJIT_PROPAGATE(_code->newLabelId(id));
  size_t index = Operand::unpackId(id);

  // We just added one label so it must be true.
  ASMJIT_ASSERT(_cbLabels.getLength() < index + 1);
  ASMJIT_PROPAGATE(_cbLabels.resize(&_cbHeap, index + 1));

  _cbLabels[index] = node;
  node->_id = id;
  return kErrorOk;
}